

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O3

void Assimp::IFC::ProcessSweptAreaSolid
               (IfcSweptAreaSolid *swept,TempMesh *meshout,ConversionData *conv)

{
  IfcExtrudedAreaSolid *solid;
  IfcRevolvedAreaSolid *solid_00;
  long *plVar1;
  size_type *psVar2;
  _func_int *p_Var3;
  allocator local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 local_190 [376];
  
  p_Var3 = (_func_int *)
           ((long)&(swept->super_IfcSolidModel).super_IfcGeometricRepresentationItem.
                   super_IfcRepresentationItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                   _vptr_ObjectHelper +
           (long)(swept->super_IfcSolidModel).super_IfcGeometricRepresentationItem.
                 super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper[-3]);
  solid = (IfcExtrudedAreaSolid *)
          __dynamic_cast(p_Var3,&STEP::Object::typeinfo,&Schema_2x3::IfcExtrudedAreaSolid::typeinfo,
                         0xffffffffffffffff);
  if (solid != (IfcExtrudedAreaSolid *)0x0) {
    ProcessExtrudedAreaSolid
              (solid,meshout,conv,
               conv->collect_openings !=
               (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0);
    return;
  }
  solid_00 = (IfcRevolvedAreaSolid *)
             __dynamic_cast(p_Var3,&STEP::Object::typeinfo,
                            &Schema_2x3::IfcRevolvedAreaSolid::typeinfo,0xffffffffffffffff);
  if (solid_00 != (IfcRevolvedAreaSolid *)0x0) {
    ProcessRevolvedAreaSolid(solid_00,meshout,conv);
    return;
  }
  std::__cxx11::string::string((string *)local_1b0,*(char **)(p_Var3 + 0x10),&local_1d1);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_1b0,0,(char *)0x0,0x6dfa63);
  psVar2 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_1d0.field_2._M_allocated_capacity = *psVar2;
    local_1d0.field_2._8_8_ = plVar1[3];
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  }
  else {
    local_1d0.field_2._M_allocated_capacity = *psVar2;
    local_1d0._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_1d0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
  basic_formatter<std::__cxx11::string>
            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_190,
             &local_1d0);
  LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_190);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0]);
  }
  return;
}

Assistant:

void ProcessSweptAreaSolid(const Schema_2x3::IfcSweptAreaSolid& swept, TempMesh& meshout,
    ConversionData& conv)
{
    if(const Schema_2x3::IfcExtrudedAreaSolid* const solid = swept.ToPtr<Schema_2x3::IfcExtrudedAreaSolid>()) {
        ProcessExtrudedAreaSolid(*solid,meshout,conv, !!conv.collect_openings);
    }
    else if(const Schema_2x3::IfcRevolvedAreaSolid* const rev = swept.ToPtr<Schema_2x3::IfcRevolvedAreaSolid>()) {
        ProcessRevolvedAreaSolid(*rev,meshout,conv);
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcSweptAreaSolid entity, type is " + swept.GetClassName());
    }
}